

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O3

Kit_Node_t * Kit_GraphAppendNode(Kit_Graph_t *pGraph)

{
  int iVar1;
  Kit_Node_t *pKVar2;
  int iVar3;
  
  iVar3 = pGraph->nSize;
  pKVar2 = pGraph->pNodes;
  if (iVar3 == pGraph->nCap) {
    if (pKVar2 == (Kit_Node_t *)0x0) {
      pKVar2 = (Kit_Node_t *)malloc((long)iVar3 * 0x30);
      iVar1 = iVar3;
    }
    else {
      pKVar2 = (Kit_Node_t *)realloc(pKVar2,(long)iVar3 * 0x30);
      iVar3 = pGraph->nSize;
      iVar1 = pGraph->nCap;
    }
    pGraph->pNodes = pKVar2;
    pGraph->nCap = iVar1 * 2;
  }
  pGraph->nSize = iVar3 + 1;
  pKVar2 = pKVar2 + iVar3;
  pKVar2->eEdge0 = (Kit_Edge_t)0x0;
  pKVar2->eEdge1 = (Kit_Edge_t)0x0;
  (pKVar2->field_2).pFunc = (void *)0x0;
  *(undefined8 *)&pKVar2->field_0x10 = 0;
  return pKVar2;
}

Assistant:

Kit_Node_t * Kit_GraphAppendNode( Kit_Graph_t * pGraph )   
{
    Kit_Node_t * pNode;
    if ( pGraph->nSize == pGraph->nCap )
    {
        pGraph->pNodes = ABC_REALLOC( Kit_Node_t, pGraph->pNodes, 2 * pGraph->nCap ); 
        pGraph->nCap   = 2 * pGraph->nCap;
    }
    pNode = pGraph->pNodes + pGraph->nSize++;
    memset( pNode, 0, sizeof(Kit_Node_t) );
    return pNode;
}